

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

void __thiscall
pbrt::CurveCommon::CurveCommon
          (CurveCommon *this,span<const_pbrt::Point3<float>_> c,Float width0,Float width1,
          CurveType type,span<const_pbrt::Normal3<float>_> norm,Transform *renderFromObject,
          Transform *objectFromRender,bool reverseOrientation)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  Normal3<float> *pNVar7;
  long in_FS_OFFSET;
  float fVar8;
  float fVar13;
  float fVar14;
  undefined1 auVar9 [16];
  float fVar15;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int vb;
  size_t va;
  undefined1 extraout_var [60];
  
  pNVar7 = norm.ptr;
  sVar6 = c.n;
  this->type = type;
  *(undefined1 (*) [32])this->cpObj = ZEXT1232(ZEXT812(0));
  *(undefined1 (*) [32])&this->cpObj[1].super_Tuple3<pbrt::Point3,_float>.y = ZEXT1232(ZEXT812(0));
  this->n[1].super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  this->n[1].super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  *(undefined1 (*) [16])this->n = ZEXT816(0) << 0x20;
  this->renderFromObject = renderFromObject;
  this->objectFromRender = objectFromRender;
  this->reverseOrientation = reverseOrientation;
  bVar4 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar4;
  this->width[0] = width0;
  this->width[1] = width1;
  vb = 4;
  va = sVar6;
  if (sVar6 == 4) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&this->cpObj[0].super_Tuple3<pbrt::Point3,_float>.z + lVar5) =
           *(undefined4 *)((long)&((c.ptr)->super_Tuple3<pbrt::Point3,_float>).z + lVar5);
      *(undefined8 *)((long)&this->cpObj[0].super_Tuple3<pbrt::Point3,_float>.x + lVar5) =
           *(undefined8 *)((long)&((c.ptr)->super_Tuple3<pbrt::Point3,_float>).x + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x30);
    if (norm.n == 2) {
      uVar1._0_4_ = (pNVar7->super_Tuple3<pbrt::Normal3,_float>).x;
      uVar1._4_4_ = (pNVar7->super_Tuple3<pbrt::Normal3,_float>).y;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar1;
      fVar19 = (pNVar7->super_Tuple3<pbrt::Normal3,_float>).z;
      auVar20._0_4_ = (float)(undefined4)uVar1 * (float)(undefined4)uVar1;
      auVar20._4_4_ = (float)uVar1._4_4_ * (float)uVar1._4_4_;
      auVar20._8_8_ = 0;
      auVar9 = vhaddps_avx(auVar20,auVar20);
      auVar9 = ZEXT416((uint)(auVar9._0_4_ + fVar19 * fVar19));
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar8 = auVar9._0_4_;
      auVar9._4_4_ = fVar8;
      auVar9._0_4_ = fVar8;
      auVar9._8_4_ = fVar8;
      auVar9._12_4_ = fVar8;
      auVar16._0_4_ = fVar19 / fVar8;
      auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar9 = vdivps_avx(auVar17,auVar9);
      uVar2 = vmovlps_avx(auVar9);
      this->n[0].super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar2;
      this->n[0].super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
      this->n[0].super_Tuple3<pbrt::Normal3,_float>.z = auVar16._0_4_;
      auVar20 = vmovshdup_avx(auVar9);
      uVar3._0_4_ = pNVar7[1].super_Tuple3<pbrt::Normal3,_float>.x;
      uVar3._4_4_ = pNVar7[1].super_Tuple3<pbrt::Normal3,_float>.y;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar3;
      fVar19 = pNVar7[1].super_Tuple3<pbrt::Normal3,_float>.z;
      auVar21._0_4_ = (float)(undefined4)uVar3 * (float)(undefined4)uVar3;
      auVar21._4_4_ = (float)uVar3._4_4_ * (float)uVar3._4_4_;
      auVar21._8_8_ = 0;
      auVar17 = vhaddps_avx(auVar21,auVar21);
      auVar17 = ZEXT416((uint)(auVar17._0_4_ + fVar19 * fVar19));
      auVar17 = vsqrtss_avx(auVar17,auVar17);
      fVar8 = auVar17._0_4_;
      auVar22._4_4_ = fVar8;
      auVar22._0_4_ = fVar8;
      auVar22._8_4_ = fVar8;
      auVar22._12_4_ = fVar8;
      fVar19 = fVar19 / fVar8;
      auVar17 = vdivps_avx(auVar18,auVar22);
      auVar18 = vmovshdup_avx(auVar17);
      uVar2 = vmovlps_avx(auVar17);
      this->n[1].super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar2;
      this->n[1].super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
      this->n[1].super_Tuple3<pbrt::Normal3,_float>.z = fVar19;
      auVar20 = vfmadd213ss_fma(auVar18,auVar20,ZEXT416((uint)(auVar16._0_4_ * fVar19)));
      auVar18 = vfmsub231ss_fma(ZEXT416((uint)(auVar16._0_4_ * fVar19)),auVar16,
                                ZEXT416((uint)fVar19));
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ + auVar18._0_4_)),auVar9,auVar17);
      if (0.0 <= auVar20._0_4_) {
        auVar9 = vsubps_avx(auVar17,auVar9);
        auVar11._0_4_ = auVar9._0_4_ * auVar9._0_4_;
        auVar11._4_4_ = auVar9._4_4_ * auVar9._4_4_;
        auVar11._8_4_ = auVar9._8_4_ * auVar9._8_4_;
        auVar11._12_4_ = auVar9._12_4_ * auVar9._12_4_;
        auVar9 = vhaddps_avx(auVar11,auVar11);
        auVar9 = ZEXT416((uint)(auVar9._0_4_ + (fVar19 - auVar16._0_4_) * (fVar19 - auVar16._0_4_)))
        ;
        auVar9 = vsqrtss_avx(auVar9,auVar9);
        auVar17 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
        auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar17);
        uVar2 = vcmpss_avx512f(auVar17,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar4 = (bool)((byte)uVar2 & 1);
        fVar19 = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
        fVar19 = fVar19 + fVar19;
      }
      else {
        fVar8 = auVar9._0_4_ + auVar17._0_4_;
        fVar13 = auVar9._4_4_ + auVar17._4_4_;
        fVar14 = auVar9._8_4_ + auVar17._8_4_;
        fVar15 = auVar9._12_4_ + auVar17._12_4_;
        auVar10._0_4_ = fVar8 * fVar8;
        auVar10._4_4_ = fVar13 * fVar13;
        auVar10._8_4_ = fVar14 * fVar14;
        auVar10._12_4_ = fVar15 * fVar15;
        auVar9 = vhaddps_avx(auVar10,auVar10);
        auVar9 = ZEXT416((uint)(auVar9._0_4_ + (auVar16._0_4_ + fVar19) * (auVar16._0_4_ + fVar19)))
        ;
        auVar9 = vsqrtss_avx(auVar9,auVar9);
        auVar17 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
        auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar17);
        uVar2 = vcmpss_avx512f(auVar17,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar4 = (bool)((byte)uVar2 & 1);
        auVar12._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
        auVar12._4_60_ = extraout_var;
        auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar12._0_16_,ZEXT416(0x40490fdb));
        fVar19 = auVar9._0_4_;
      }
      this->normalAngle = fVar19;
      fVar19 = sinf(fVar19);
      this->invSinNormalAngle = 1.0 / fVar19;
    }
    *(long *)(in_FS_OFFSET + -0x3c0) = *(long *)(in_FS_OFFSET + -0x3c0) + 1;
    return;
  }
  LogFatal<char_const(&)[9],char_const(&)[2],char_const(&)[9],unsigned_long&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
             ,0x1ce,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])0x551f67,
             (char (*) [2])0x560dfa,(char (*) [9])0x551f67,&va,(char (*) [2])0x560dfa,&vb);
}

Assistant:

CurveCommon::CurveCommon(pstd::span<const Point3f> c, Float width0, Float width1,
                         CurveType type, pstd::span<const Normal3f> norm,
                         const Transform *renderFromObject,
                         const Transform *objectFromRender, bool reverseOrientation)
    : type(type),
      renderFromObject(renderFromObject),
      objectFromRender(objectFromRender),
      reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject->SwapsHandedness()) {
    width[0] = width0;
    width[1] = width1;
    CHECK_EQ(c.size(), 4);
    for (int i = 0; i < 4; ++i)
        cpObj[i] = c[i];
    if (norm.size() == 2) {
        n[0] = Normalize(norm[0]);
        n[1] = Normalize(norm[1]);
        normalAngle = AngleBetween(n[0], n[1]);
        invSinNormalAngle = 1 / std::sin(normalAngle);
    }
    ++nCurves;
}